

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageModule.cpp
# Opt level: O1

MessageTemplate * __thiscall
ki::protocol::dml::MessageModule::get_message_template(MessageModule *this,uint8_t type)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppMVar2;
  mapped_type pMVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  key_type local_1;
  
  p_Var1 = &(this->m_message_type_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->m_message_type_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar6]) {
    bVar6 = (byte)(char)p_Var5[1]._M_color < type;
    if (!bVar6) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var5 = p_Var4, type < (byte)(char)p_Var4[1]._M_color)) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    pMVar3 = (MessageTemplate *)0x0;
  }
  else {
    ppMVar2 = std::
              map<unsigned_char,_ki::protocol::dml::MessageTemplate_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_ki::protocol::dml::MessageTemplate_*>_>_>
              ::at(&this->m_message_type_map,&local_1);
    pMVar3 = *ppMVar2;
  }
  return pMVar3;
}

Assistant:

const MessageTemplate *MessageModule::get_message_template(uint8_t type) const
	{
		if (m_message_type_map.count(type) == 1)
			return m_message_type_map.at(type);
		return nullptr;
	}